

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeNext(BtCursor *pCur,int *pRes)

{
  short sVar1;
  uint uVar2;
  MemPage *pMVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  
  bVar4 = pCur->eState;
  if (bVar4 != 1) {
    if (2 < bVar4) {
      iVar5 = btreeRestoreCursorPosition(pCur);
      if (iVar5 != 0) {
        return iVar5;
      }
      bVar4 = pCur->eState;
    }
    if (bVar4 == 0) {
      *pRes = 1;
      return 0;
    }
    iVar5 = pCur->skipNext;
    if (iVar5 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar5) {
        return 0;
      }
    }
  }
  sVar1 = pCur->iPage;
  pMVar3 = pCur->apPage[sVar1];
  uVar7 = pCur->aiIdx[sVar1] + 1;
  pCur->aiIdx[sVar1] = uVar7;
  if (uVar7 < pMVar3->nCell) {
    if (pMVar3->leaf == '\0') {
LAB_001363ef:
      iVar5 = moveToLeftmost(pCur);
      return iVar5;
    }
  }
  else {
    if (pMVar3->leaf == '\0') {
      uVar2 = *(uint *)(pMVar3->aData + (ulong)pMVar3->hdrOffset + 8);
      iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                               uVar2 << 0x18);
      if (iVar5 != 0) {
        return iVar5;
      }
      goto LAB_001363ef;
    }
    uVar6 = (ulong)(ushort)pCur->iPage;
    do {
      if ((short)uVar6 == 0) {
        *pRes = 1;
        pCur->eState = '\0';
        return 0;
      }
      moveToParent(pCur);
      uVar6 = (ulong)pCur->iPage;
    } while (pCur->apPage[uVar6]->nCell <= pCur->aiIdx[uVar6]);
    if (pCur->apPage[uVar6]->intKey != '\0') {
      iVar5 = sqlite3BtreeNext(pCur,pRes);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur, int *pRes){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorHoldsMutex(pCur) );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  assert( *pRes==0 );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      *pRes = 1;
      return SQLITE_OK;
    }
    if( pCur->skipNext ){
      assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_SKIPNEXT );
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ){
        pCur->skipNext = 0;
        return SQLITE_OK;
      }
      pCur->skipNext = 0;
    }
  }

  pPage = pCur->apPage[pCur->iPage];
  idx = ++pCur->aiIdx[pCur->iPage];
  assert( pPage->isInit );

  /* If the database file is corrupt, it is possible for the value of idx 
  ** to be invalid here. This can only occur if a second cursor modifies
  ** the page while cursor pCur is holding a reference to it. Which can
  ** only happen if the database is corrupt in such a way as to link the
  ** page into more than one b-tree structure. */
  testcase( idx>pPage->nCell );

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        *pRes = 1;
        pCur->eState = CURSOR_INVALID;
        return SQLITE_OK;
      }
      moveToParent(pCur);
      pPage = pCur->apPage[pCur->iPage];
    }while( pCur->aiIdx[pCur->iPage]>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, pRes);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}